

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialQueue.cpp
# Opt level: O0

void __thiscall SerialExecutionQueue::~SerialExecutionQueue(SerialExecutionQueue *this)

{
  SerialQueueImpl *this_00;
  bool bVar1;
  undefined1 local_28 [8];
  unique_lock<std::mutex> lock;
  lock_guard<std::mutex> guard;
  SerialExecutionQueue *this_local;
  
  (this->super_ExecutionQueue)._vptr_ExecutionQueue =
       (_func_int **)&PTR__SerialExecutionQueue_00300618;
  this_00 = this->queue;
  if (this_00 != (SerialQueueImpl *)0x0) {
    anon_unknown.dwarf_a9701::SerialQueueImpl::~SerialQueueImpl(this_00);
    operator_delete(this_00,0xb0);
  }
  this->queue = (SerialQueueImpl *)0x0;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&lock._M_owns,&this->killAfterTimeoutThreadMutex);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->killAfterTimeoutThread);
  if (bVar1) {
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)local_28,&this->queueCompleteMutex);
    this->queueComplete = true;
    std::condition_variable::notify_all();
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
    std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::operator->
              (&this->killAfterTimeoutThread);
    std::thread::join();
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&lock._M_owns);
  std::condition_variable::~condition_variable(&this->queueCompleteCondition);
  std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::~unique_ptr
            (&this->killAfterTimeoutThread);
  llbuild::basic::ProcessGroup::~ProcessGroup(&this->spawnedProcesses);
  llbuild::basic::ExecutionQueue::~ExecutionQueue(&this->super_ExecutionQueue);
  return;
}

Assistant:

virtual ~SerialExecutionQueue()
  {
    delete queue;
    queue = nullptr;

    std::lock_guard<std::mutex> guard(killAfterTimeoutThreadMutex);
    if (killAfterTimeoutThread) {
      {
        std::unique_lock<std::mutex> lock(queueCompleteMutex);
        queueComplete = true;
        queueCompleteCondition.notify_all();
      }
      killAfterTimeoutThread->join();
    }
  }